

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O2

RK_S32 vp8e_calc_cost_mv(RK_S32 mvd,RK_S32 *mv_prob)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  RK_S32 RVar4;
  RK_S32 *pRVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  uVar2 = mvd >> 1;
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  if (uVar1 < 8) {
    pRVar5 = mv_tree_tbl[uVar1].index;
    uVar2 = mv_tree_tbl[uVar1].number;
    iVar3 = 0;
    while (uVar2 = uVar2 - 1, uVar2 != 0xffffffff) {
      iVar6 = 0xff - mv_prob[(long)*pRVar5 + 2];
      if (((uint)mv_tree_tbl[uVar1].value >> (uVar2 & 0x1f) & 1) == 0) {
        iVar6 = mv_prob[(long)*pRVar5 + 2];
      }
      pRVar5 = pRVar5 + 1;
      iVar3 = iVar3 + vp8_prob_cost_tbl[iVar6];
    }
    RVar4 = iVar3 + vp8_prob_cost_tbl[*mv_prob];
    if ((uint)mvd < 2) {
      return RVar4;
    }
  }
  else {
    RVar4 = vp8_prob_cost_tbl[0xff - *mv_prob];
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      iVar3 = 0xff - mv_prob[lVar7 + 9];
      if ((uVar1 >> ((uint)lVar7 & 0x1f) & 1) == 0) {
        iVar3 = mv_prob[lVar7 + 9];
      }
      RVar4 = RVar4 + vp8_prob_cost_tbl[iVar3];
    }
    for (uVar8 = 9; 3 < uVar8; uVar8 = uVar8 - 1) {
      iVar3 = 0xff - mv_prob[uVar8 + 9];
      if ((uVar1 >> ((uint)uVar8 & 0x1f) & 1) == 0) {
        iVar3 = mv_prob[uVar8 + 9];
      }
      RVar4 = RVar4 + vp8_prob_cost_tbl[iVar3];
    }
    if (0xf < uVar1) {
      iVar3 = 0xff - mv_prob[0xc];
      if ((uVar1 & 8) == 0) {
        iVar3 = mv_prob[0xc];
      }
      RVar4 = RVar4 + vp8_prob_cost_tbl[iVar3];
    }
  }
  iVar3 = 0xff - mv_prob[1];
  if (-1 < mvd) {
    iVar3 = mv_prob[1];
  }
  return RVar4 + vp8_prob_cost_tbl[iVar3];
}

Assistant:

RK_S32 vp8e_calc_cost_mv(RK_S32 mvd, RK_S32 *mv_prob)
{
    RK_S32 i = 0;
    RK_S32 bit_cost = 0;

    RK_S32 tmp = MPP_ABS(mvd >> 1);

    if (tmp < 8) {
        bit_cost += COST_BOOL(mv_prob[0], 0);
        bit_cost += get_cost_tree(&mv_tree_tbl[tmp], mv_prob + 2);
        if (!tmp)
            return bit_cost;

        /* Sign */
        bit_cost += COST_BOOL(mv_prob[1], mvd < 0);
        return bit_cost;
    }

    bit_cost += COST_BOOL(mv_prob[0], 1);

    for (i = 0; i < 3; i++) {
        bit_cost += COST_BOOL(mv_prob[9 + i], (tmp >> i) & 1);
    }

    for (i = 9; i > 3; i--) {
        bit_cost += COST_BOOL(mv_prob[9 + i], (tmp >> i) & 1);
    }

    if (tmp > 15) {
        bit_cost += COST_BOOL(mv_prob[9 + 3], (tmp >> 3) & 1);
    }

    bit_cost += COST_BOOL(mv_prob[1], mvd < 0);

    return bit_cost;
}